

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O3

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,char *s,int32_t sLength)

{
  byte bVar1;
  int iVar2;
  UStringTrieResult UVar3;
  char cVar4;
  uint inByte;
  int iVar5;
  byte *pbVar6;
  byte *pos;
  long lVar7;
  int iVar8;
  
  if (sLength < 0) {
    if (*s == '\0') goto LAB_001c3dc8;
  }
  else if (sLength == 0) {
LAB_001c3dc8:
    if (this->pos_ == (byte *)0x0) {
      return USTRINGTRIE_NO_MATCH;
    }
    if (-1 < this->remainingMatchLength_) {
      return USTRINGTRIE_NO_VALUE;
    }
    bVar1 = *this->pos_;
LAB_001c3e08:
    if (0x1f < bVar1) {
      return bVar1 & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
    return USTRINGTRIE_NO_VALUE;
  }
  pos = this->pos_;
  if (pos == (byte *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  iVar5 = this->remainingMatchLength_;
LAB_001c3c9a:
  if (sLength < 0) {
    cVar4 = *s;
    if (cVar4 != '\0') {
      iVar2 = -1;
      if (iVar5 < -1) {
        iVar2 = iVar5;
      }
      while( true ) {
        s = s + 1;
        inByte = (uint)cVar4;
        if (iVar5 < 0) break;
        if (inByte != *pos) goto LAB_001c3de1;
        pos = pos + 1;
        iVar5 = iVar5 + -1;
        cVar4 = *s;
        if (cVar4 == '\0') goto LAB_001c3df5;
      }
      goto LAB_001c3d2d;
    }
  }
  else if (sLength != 0) {
    iVar2 = -1;
    if (iVar5 < -1) {
      iVar2 = iVar5;
    }
    lVar7 = 0;
    iVar8 = iVar5;
    while (inByte = (uint)s[lVar7], -1 < iVar8) {
      if (inByte != pos[lVar7]) goto LAB_001c3de1;
      iVar8 = iVar8 + -1;
      lVar7 = lVar7 + 1;
      if (sLength == (uint)lVar7) {
        pos = pos + (uint)sLength;
        iVar5 = iVar5 - sLength;
        goto LAB_001c3df5;
      }
    }
    s = s + lVar7 + 1;
    sLength = sLength + ~(uint)lVar7;
    pos = pos + lVar7;
LAB_001c3d2d:
    this->remainingMatchLength_ = iVar2;
    while( true ) {
      while( true ) {
        pbVar6 = pos;
        pos = pbVar6 + 1;
        bVar1 = *pbVar6;
        if (0xf < bVar1) break;
        UVar3 = branchNext(this,pos,(uint)bVar1,inByte);
        if (UVar3 == USTRINGTRIE_NO_MATCH) {
          return USTRINGTRIE_NO_MATCH;
        }
        if (sLength < 0) {
          cVar4 = *s;
          if (cVar4 == '\0') {
            return UVar3;
          }
        }
        else {
          if (sLength == 0) {
            return UVar3;
          }
          cVar4 = *s;
          sLength = sLength - 1;
        }
        if (UVar3 == USTRINGTRIE_FINAL_VALUE) goto LAB_001c3de1;
        inByte = (uint)cVar4;
        s = s + 1;
        pos = this->pos_;
      }
      if (bVar1 < 0x20) break;
      if ((bVar1 & 1) != 0) goto LAB_001c3de1;
      if (0xa1 < bVar1) {
        if (bVar1 < 0xd8) {
          pos = pbVar6 + 2;
        }
        else if (bVar1 < 0xfc) {
          pos = pbVar6 + 3;
        }
        else {
          pos = pbVar6 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
        }
      }
    }
    if (inByte != *pos) {
LAB_001c3de1:
      this->pos_ = (uint8_t *)0x0;
      return USTRINGTRIE_NO_MATCH;
    }
    pos = pbVar6 + 2;
    iVar5 = bVar1 - 0x11;
    goto LAB_001c3c9a;
  }
LAB_001c3df5:
  this->remainingMatchLength_ = iVar5;
  this->pos_ = pos;
  if (-1 < iVar5) {
    return USTRINGTRIE_NO_VALUE;
  }
  bVar1 = *pos;
  goto LAB_001c3e08;
}

Assistant:

UStringTrieResult
BytesTrie::next(const char *s, int32_t sLength) {
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input byte, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t inByte;
        if(sLength<0) {
            for(;;) {
                if((inByte=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                inByte=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        for(;;) {
            int32_t node=*pos++;
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, inByte);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input byte, if there is one.
                if(sLength<0) {
                    if((inByte=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    inByte=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching bytes.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
            } else if(node<kMinValueLead) {
                // Match length+1 bytes.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching bytes.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipValue(pos, node);
                // The next node must not also be a value node.
                U_ASSERT(*pos<kMinValueLead);
            }
        }
    }
}